

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O2

pair<ska::detailv3::sherwood_v3_table<std::pair<const_slang::ast::Symbol_*,_const_slang::ast::Expression_*>,_const_slang::ast::Symbol_*,_std::hash<const_slang::ast::Symbol_*>,_ska::detailv3::KeyOrValueHasher<const_slang::ast::Symbol_*,_std::pair<const_slang::ast::Symbol_*,_const_slang::ast::Expression_*>,_std::hash<const_slang::ast::Symbol_*>_>,_std::equal_to<const_slang::ast::Symbol_*>,_ska::detailv3::KeyOrValueEquality<const_slang::ast::Symbol_*,_std::pair<const_slang::ast::Symbol_*,_const_slang::ast::Expression_*>,_std::equal_to<const_slang::ast::Symbol_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::ast::Symbol_*,_const_slang::ast::Expression_*>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::ast::Symbol_*,_const_slang::ast::Expression_*>_>,_8UL>_>::templated_iterator<std::pair<const_slang::ast::Symbol_*,_const_slang::ast::Expression_*>_>,_bool>
 __thiscall
ska::detailv3::
sherwood_v3_table<std::pair<slang::ast::Symbol_const*,slang::ast::Expression_const*>,slang::ast::Symbol_const*,std::hash<slang::ast::Symbol_const*>,ska::detailv3::KeyOrValueHasher<slang::ast::Symbol_const*,std::pair<slang::ast::Symbol_const*,slang::ast::Expression_const*>,std::hash<slang::ast::Symbol_const*>>,std::equal_to<slang::ast::Symbol_const*>,ska::detailv3::KeyOrValueEquality<slang::ast::Symbol_const*,std::pair<slang::ast::Symbol_const*,slang::ast::Expression_const*>,std::equal_to<slang::ast::Symbol_const*>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ast::Symbol_const*,slang::ast::Expression_const*>>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ast::Symbol_const*,slang::ast::Expression_const*>>,8ul>>
::emplace_new_key<std::pair<slang::ast::Symbol_const*,slang::ast::Expression_const*>>
          (sherwood_v3_table<std::pair<slang::ast::Symbol_const*,slang::ast::Expression_const*>,slang::ast::Symbol_const*,std::hash<slang::ast::Symbol_const*>,ska::detailv3::KeyOrValueHasher<slang::ast::Symbol_const*,std::pair<slang::ast::Symbol_const*,slang::ast::Expression_const*>,std::hash<slang::ast::Symbol_const*>>,std::equal_to<slang::ast::Symbol_const*>,ska::detailv3::KeyOrValueEquality<slang::ast::Symbol_const*,std::pair<slang::ast::Symbol_const*,slang::ast::Expression_const*>,std::equal_to<slang::ast::Symbol_const*>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ast::Symbol_const*,slang::ast::Expression_const*>>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ast::Symbol_const*,slang::ast::Expression_const*>>,8ul>>
           *this,int8_t distance_from_desired,EntryPointer current_entry,
          pair<const_slang::ast::Symbol_*,_const_slang::ast::Expression_*> *key)

{
  Symbol *pSVar1;
  Expression *pEVar2;
  long lVar3;
  Expression *pEVar4;
  Symbol *pSVar5;
  EntryPointer psVar6;
  EntryPointer psVar7;
  sherwood_v3_table<std::pair<slang::ast::Symbol_const*,slang::ast::Expression_const*>,slang::ast::Symbol_const*,std::hash<slang::ast::Symbol_const*>,ska::detailv3::KeyOrValueHasher<slang::ast::Symbol_const*,std::pair<slang::ast::Symbol_const*,slang::ast::Expression_const*>,std::hash<slang::ast::Symbol_const*>>,std::equal_to<slang::ast::Symbol_const*>,ska::detailv3::KeyOrValueEquality<slang::ast::Symbol_const*,std::pair<slang::ast::Symbol_const*,slang::ast::Expression_const*>,std::equal_to<slang::ast::Symbol_const*>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ast::Symbol_const*,slang::ast::Expression_const*>>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ast::Symbol_const*,slang::ast::Expression_const*>>,8ul>>
  sVar8;
  char __tmp_3;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  pair<ska::detailv3::sherwood_v3_table<std::pair<const_slang::ast::Symbol_*,_const_slang::ast::Expression_*>,_const_slang::ast::Symbol_*,_std::hash<const_slang::ast::Symbol_*>,_ska::detailv3::KeyOrValueHasher<const_slang::ast::Symbol_*,_std::pair<const_slang::ast::Symbol_*,_const_slang::ast::Expression_*>,_std::hash<const_slang::ast::Symbol_*>_>,_std::equal_to<const_slang::ast::Symbol_*>,_ska::detailv3::KeyOrValueEquality<const_slang::ast::Symbol_*,_std::pair<const_slang::ast::Symbol_*,_const_slang::ast::Expression_*>,_std::equal_to<const_slang::ast::Symbol_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::ast::Symbol_*,_const_slang::ast::Expression_*>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::ast::Symbol_*,_const_slang::ast::Expression_*>_>,_8UL>_>::templated_iterator<std::pair<const_slang::ast::Symbol_*,_const_slang::ast::Expression_*>_>,_bool>
  pVar12;
  pair<const_slang::ast::Symbol_*,_const_slang::ast::Expression_*> local_28;
  char cVar9;
  
  if ((*(long *)(this + 0x10) != 0) &&
     (this[0x19] !=
      (sherwood_v3_table<std::pair<slang::ast::Symbol_const*,slang::ast::Expression_const*>,slang::ast::Symbol_const*,std::hash<slang::ast::Symbol_const*>,ska::detailv3::KeyOrValueHasher<slang::ast::Symbol_const*,std::pair<slang::ast::Symbol_const*,slang::ast::Expression_const*>,std::hash<slang::ast::Symbol_const*>>,std::equal_to<slang::ast::Symbol_const*>,ska::detailv3::KeyOrValueEquality<slang::ast::Symbol_const*,std::pair<slang::ast::Symbol_const*,slang::ast::Expression_const*>,std::equal_to<slang::ast::Symbol_const*>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ast::Symbol_const*,slang::ast::Expression_const*>>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ast::Symbol_const*,slang::ast::Expression_const*>>,8ul>>
       )distance_from_desired)) {
    pSVar5 = (Symbol *)(*(long *)(this + 0x20) + 1);
    auVar10._8_4_ = (int)((ulong)pSVar5 >> 0x20);
    auVar10._0_8_ = pSVar5;
    auVar10._12_4_ = 0x45300000;
    lVar3 = *(long *)(this + 0x10) + 1;
    auVar11._8_4_ = (int)((ulong)lVar3 >> 0x20);
    auVar11._0_8_ = lVar3;
    auVar11._12_4_ = 0x45300000;
    if ((auVar10._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)pSVar5) - 4503599627370496.0) <=
        (double)*(float *)(this + 0x1c) *
        ((auVar11._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0))) {
      cVar9 = current_entry->distance_from_desired;
      if (cVar9 < '\0') {
        pEVar4 = key->second;
        (current_entry->field_1).value.first = key->first;
        (current_entry->field_1).value.second = pEVar4;
        current_entry->distance_from_desired = distance_from_desired;
LAB_0030e73d:
        *(long *)(this + 0x20) = *(long *)(this + 0x20) + 1;
        pVar12._9_7_ = (int7)((ulong)pSVar5 >> 8);
        pVar12.second = true;
        pVar12.first.current = current_entry;
        return pVar12;
      }
      pSVar1 = key->first;
      pEVar2 = key->second;
      current_entry->distance_from_desired = distance_from_desired;
      pSVar5 = (current_entry->field_1).value.first;
      pEVar4 = (current_entry->field_1).value.second;
      (current_entry->field_1).value.first = pSVar1;
      (current_entry->field_1).value.second = pEVar2;
      psVar6 = current_entry;
      do {
        sVar8 = (sherwood_v3_table<std::pair<slang::ast::Symbol_const*,slang::ast::Expression_const*>,slang::ast::Symbol_const*,std::hash<slang::ast::Symbol_const*>,ska::detailv3::KeyOrValueHasher<slang::ast::Symbol_const*,std::pair<slang::ast::Symbol_const*,slang::ast::Expression_const*>,std::hash<slang::ast::Symbol_const*>>,std::equal_to<slang::ast::Symbol_const*>,ska::detailv3::KeyOrValueEquality<slang::ast::Symbol_const*,std::pair<slang::ast::Symbol_const*,slang::ast::Expression_const*>,std::equal_to<slang::ast::Symbol_const*>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ast::Symbol_const*,slang::ast::Expression_const*>>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ast::Symbol_const*,slang::ast::Expression_const*>>,8ul>>
                 )(cVar9 + '\x01');
        psVar7 = psVar6;
        while( true ) {
          psVar6 = psVar7 + 1;
          cVar9 = psVar6->distance_from_desired;
          if (cVar9 < '\0') {
            psVar7[1].field_1.value.first = pSVar5;
            psVar7[1].field_1.value.second = pEVar4;
            psVar6->distance_from_desired = (int8_t)sVar8;
            goto LAB_0030e73d;
          }
          if (cVar9 < (char)sVar8) break;
          sVar8 = (sherwood_v3_table<std::pair<slang::ast::Symbol_const*,slang::ast::Expression_const*>,slang::ast::Symbol_const*,std::hash<slang::ast::Symbol_const*>,ska::detailv3::KeyOrValueHasher<slang::ast::Symbol_const*,std::pair<slang::ast::Symbol_const*,slang::ast::Expression_const*>,std::hash<slang::ast::Symbol_const*>>,std::equal_to<slang::ast::Symbol_const*>,ska::detailv3::KeyOrValueEquality<slang::ast::Symbol_const*,std::pair<slang::ast::Symbol_const*,slang::ast::Expression_const*>,std::equal_to<slang::ast::Symbol_const*>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ast::Symbol_const*,slang::ast::Expression_const*>>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ast::Symbol_const*,slang::ast::Expression_const*>>,8ul>>
                   )((char)sVar8 + '\x01');
          psVar7 = psVar6;
          if (this[0x19] == sVar8) {
            local_28.first = (current_entry->field_1).value.first;
            local_28.second = (current_entry->field_1).value.second;
            (current_entry->field_1).value.first = pSVar5;
            (current_entry->field_1).value.second = pEVar4;
            key = &local_28;
            goto LAB_0030e758;
          }
        }
        psVar6->distance_from_desired = (int8_t)sVar8;
        pSVar1 = psVar7[1].field_1.value.first;
        pEVar2 = psVar7[1].field_1.value.second;
        psVar7[1].field_1.value.first = pSVar5;
        psVar7[1].field_1.value.second = pEVar4;
        pEVar4 = pEVar2;
        pSVar5 = pSVar1;
      } while( true );
    }
  }
LAB_0030e758:
  sherwood_v3_table<std::pair<const_slang::ast::Symbol_*,_const_slang::ast::Expression_*>,_const_slang::ast::Symbol_*,_std::hash<const_slang::ast::Symbol_*>,_ska::detailv3::KeyOrValueHasher<const_slang::ast::Symbol_*,_std::pair<const_slang::ast::Symbol_*,_const_slang::ast::Expression_*>,_std::hash<const_slang::ast::Symbol_*>_>,_std::equal_to<const_slang::ast::Symbol_*>,_ska::detailv3::KeyOrValueEquality<const_slang::ast::Symbol_*,_std::pair<const_slang::ast::Symbol_*,_const_slang::ast::Expression_*>,_std::equal_to<const_slang::ast::Symbol_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::ast::Symbol_*,_const_slang::ast::Expression_*>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::ast::Symbol_*,_const_slang::ast::Expression_*>_>,_8UL>_>
  ::grow((sherwood_v3_table<std::pair<const_slang::ast::Symbol_*,_const_slang::ast::Expression_*>,_const_slang::ast::Symbol_*,_std::hash<const_slang::ast::Symbol_*>,_ska::detailv3::KeyOrValueHasher<const_slang::ast::Symbol_*,_std::pair<const_slang::ast::Symbol_*,_const_slang::ast::Expression_*>,_std::hash<const_slang::ast::Symbol_*>_>,_std::equal_to<const_slang::ast::Symbol_*>,_ska::detailv3::KeyOrValueEquality<const_slang::ast::Symbol_*,_std::pair<const_slang::ast::Symbol_*,_const_slang::ast::Expression_*>,_std::equal_to<const_slang::ast::Symbol_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::ast::Symbol_*,_const_slang::ast::Expression_*>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::ast::Symbol_*,_const_slang::ast::Expression_*>_>,_8UL>_>
          *)this);
  pVar12 = emplace<std::pair<slang::ast::Symbol_const*,slang::ast::Expression_const*>>(this,key);
  return pVar12;
}

Assistant:

emplace_new_key(int8_t distance_from_desired, EntryPointer current_entry, Key && key, Args &&... args)
    {
        using std::swap;
        if (num_slots_minus_one == 0 || distance_from_desired == max_lookups || num_elements + 1 > (num_slots_minus_one + 1) * static_cast<double>(_max_load_factor))
        {
            grow();
            return emplace(std::forward<Key>(key), std::forward<Args>(args)...);
        }
        else if (current_entry->is_empty())
        {
            current_entry->emplace(distance_from_desired, std::forward<Key>(key), std::forward<Args>(args)...);
            ++num_elements;
            return { { current_entry }, true };
        }
        value_type to_insert(std::forward<Key>(key), std::forward<Args>(args)...);
        swap(distance_from_desired, current_entry->distance_from_desired);
        swap(to_insert, current_entry->value);
        iterator result = { current_entry };
        for (++distance_from_desired, ++current_entry;; ++current_entry)
        {
            if (current_entry->is_empty())
            {
                current_entry->emplace(distance_from_desired, std::move(to_insert));
                ++num_elements;
                return { result, true };
            }
            else if (current_entry->distance_from_desired < distance_from_desired)
            {
                swap(distance_from_desired, current_entry->distance_from_desired);
                swap(to_insert, current_entry->value);
                ++distance_from_desired;
            }
            else
            {
                ++distance_from_desired;
                if (distance_from_desired == max_lookups)
                {
                    swap(to_insert, result.current->value);
                    grow();
                    return emplace(std::move(to_insert));
                }
            }
        }
    }